

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void pcache1TruncateUnsafe(PCache1 *pCache,uint iLimit)

{
  uint *puVar1;
  uint uVar2;
  PgHdr1 *pPVar3;
  PgHdr1 *pPVar4;
  ulong uVar5;
  PgHdr1 *p;
  PgHdr1 **ppPVar6;
  ulong uVar7;
  
  uVar2 = pCache->nHash;
  if (pCache->iMaxKey - iLimit < uVar2) {
    uVar5 = (ulong)iLimit % (ulong)uVar2;
    uVar7 = (ulong)pCache->iMaxKey % (ulong)uVar2;
  }
  else {
    uVar7 = (ulong)((uVar2 >> 1) - 1);
    uVar5 = (ulong)(uVar2 >> 1);
  }
  while( true ) {
    p = pCache->apHash[uVar5];
    if (p != (PgHdr1 *)0x0) {
      ppPVar6 = pCache->apHash + uVar5;
      do {
        if (p->iKey < iLimit) {
          ppPVar6 = &p->pNext;
        }
        else {
          pCache->nPage = pCache->nPage - 1;
          *ppPVar6 = p->pNext;
          pPVar3 = p->pLruNext;
          if (pPVar3 != (PgHdr1 *)0x0) {
            pPVar4 = p->pLruPrev;
            pPVar4->pLruNext = pPVar3;
            pPVar3->pLruPrev = pPVar4;
            p->pLruNext = (PgHdr1 *)0x0;
            puVar1 = &p->pCache->nRecyclable;
            *puVar1 = *puVar1 - 1;
          }
          pcache1FreePage(p);
        }
        p = *ppPVar6;
      } while (p != (PgHdr1 *)0x0);
    }
    if ((int)uVar5 == (int)uVar7) break;
    uVar5 = (ulong)((int)uVar5 + 1) % (ulong)pCache->nHash;
  }
  return;
}

Assistant:

static void pcache1TruncateUnsafe(
  PCache1 *pCache,             /* The cache to truncate */
  unsigned int iLimit          /* Drop pages with this pgno or larger */
){
  TESTONLY( int nPage = 0; )  /* To assert pCache->nPage is correct */
  unsigned int h, iStop;
  assert( sqlite3_mutex_held(pCache->pGroup->mutex) );
  assert( pCache->iMaxKey >= iLimit );
  assert( pCache->nHash > 0 );
  if( pCache->iMaxKey - iLimit < pCache->nHash ){
    /* If we are just shaving the last few pages off the end of the
    ** cache, then there is no point in scanning the entire hash table.
    ** Only scan those hash slots that might contain pages that need to
    ** be removed. */
    h = iLimit % pCache->nHash;
    iStop = pCache->iMaxKey % pCache->nHash;
    TESTONLY( nPage = -10; )  /* Disable the pCache->nPage validity check */
  }else{
    /* This is the general case where many pages are being removed.
    ** It is necessary to scan the entire hash table */
    h = pCache->nHash/2;
    iStop = h - 1;
  }
  for(;;){
    PgHdr1 **pp;
    PgHdr1 *pPage;
    assert( h<pCache->nHash );
    pp = &pCache->apHash[h];
    while( (pPage = *pp)!=0 ){
      if( pPage->iKey>=iLimit ){
        pCache->nPage--;
        *pp = pPage->pNext;
        if( PAGE_IS_UNPINNED(pPage) ) pcache1PinPage(pPage);
        pcache1FreePage(pPage);
      }else{
        pp = &pPage->pNext;
        TESTONLY( if( nPage>=0 ) nPage++; )
      }
    }
    if( h==iStop ) break;
    h = (h+1) % pCache->nHash;
  }
  assert( nPage<0 || pCache->nPage==(unsigned)nPage );
}